

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapSort.c
# Opt level: O2

void HeapSort(int *sort,int length)

{
  int iVar1;
  uint i;
  ulong uVar2;
  
  uVar2 = (long)length / 2 & 0xffffffff;
  while (0 < (int)uVar2) {
    i = (int)uVar2 - 1;
    HeapAdjust(sort,i,length);
    uVar2 = (ulong)i;
  }
  while (0 < length) {
    length = length - 1;
    iVar1 = sort[(uint)length];
    sort[(uint)length] = *sort;
    *sort = iVar1;
    HeapAdjust(sort,0,length);
  }
  return;
}

Assistant:

void HeapSort(int sort[], int length)
{
    // 初始化堆
    // length / 2 - 1是二叉树中最后一个非叶子结点的序号
    for (int i = length / 2 - 1; i >= 0; i--)
    {
        HeapAdjust(sort, i, length);
    }
    // 交换堆顶元素和最后一个元素
    for (int i = length - 1; i >= 0; i--)
    {
        int temp;
        temp = sort[i];
        sort[i] = sort[0];
        sort[0] = temp;
        HeapAdjust(sort, 0, i);
    }
}